

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_partition.c
# Opt level: O0

aom_codec_err_t av1_ext_part_delete(ExtPartController *ext_part_controller)

{
  int iVar1;
  int *in_RDI;
  aom_ext_part_status_t status;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  aom_codec_err_t local_4;
  
  if (in_RDI == (int *)0x0) {
    local_4 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    if (*in_RDI != 0) {
      iVar1 = (**(code **)(in_RDI + 0xe))(*(undefined8 *)(in_RDI + 4));
      if (iVar1 != 0) {
        return AOM_CODEC_ERROR;
      }
      in_stack_ffffffffffffffec = 0;
    }
    local_4 = ext_part_init((ExtPartController *)
                            CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  }
  return local_4;
}

Assistant:

aom_codec_err_t av1_ext_part_delete(ExtPartController *ext_part_controller) {
  if (ext_part_controller == NULL) {
    return AOM_CODEC_INVALID_PARAM;
  }
  if (ext_part_controller->ready) {
    const aom_ext_part_status_t status =
        ext_part_controller->funcs.delete_model(ext_part_controller->model);
    if (status != AOM_EXT_PART_OK) {
      return AOM_CODEC_ERROR;
    }
  }
  return ext_part_init(ext_part_controller);
}